

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O1

int testStorageReaderTestsTruncatedHeader(void)

{
  pointer pcVar1;
  string *this;
  string *psVar2;
  ostream *poVar3;
  initializer_list<unsigned_short> __l;
  Span<unsigned_short,_18446744073709551615UL> data;
  StorageReader reader;
  AutoDeleteTempFile tempfile;
  allocator_type local_89;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_88;
  string local_70;
  AutoDeleteTempFile local_50;
  unsigned_short local_28 [4];
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_50);
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 2;
  local_28[3] = 0;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_88,__l,&local_89);
  this = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_50);
  psVar2 = (string *)0x0;
  if ((long)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    psVar2 = (string *)
             local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  data.m_ptr = (pointer)((long)local_88.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_88.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 1);
  data.m_size.m_size =
       (size_t)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,18446744073709551615ul>
            ((TestUtil *)this,psVar2,data);
  if ((string *)
      local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (string *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_50);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + psVar2->_M_string_length);
  MILBlob::Blob::StorageReader::StorageReader((StorageReader *)&local_88,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  MILBlob::Blob::StorageReader::GetDataView<float>((StorageReader *)&local_88,0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
             ,0x7a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,": expected exception, but none thrown.\n",0x27);
  MILBlob::Blob::StorageReader::~StorageReader((StorageReader *)&local_88);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_50);
  return 1;
}

Assistant:

int testStorageReaderTestsTruncatedHeader()
{
    AutoDeleteTempFile tempfile;

    {
        // count=0, version=2
        std::vector<uint16_t> bytes{0x0000, 0x0000, 0x0002, 0x0000};
        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(bytes));
    }

    StorageReader reader(tempfile.GetFilename());
    ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<float>(40), std::range_error, "index out of bounds");

    return 0;
}